

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testAdaptiveSampler_Test::TestBody
          (Sampler_testAdaptiveSampler_Test *this)

{
  initializer_list<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy> __l;
  bool bVar1;
  char *pcVar2;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  OperationSamplingStrategy *local_8f0;
  AssertHelper local_8d8 [8];
  Message local_8d0 [8];
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_5;
  Tag thriftTagVec_2;
  Tag local_828 [8];
  Tag thriftTagArr_2;
  ulong local_798;
  size_t i_2;
  Message local_788 [8];
  size_type local_780;
  unsigned_long local_778;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_740 [8];
  Message local_738 [15];
  bool local_729;
  undefined1 local_728 [8];
  AssertionResult gtest_ar__3;
  string local_710 [32];
  TraceID local_6f0;
  SamplingStatus local_6e0;
  AssertionResult local_6c0 [2];
  AssertHelper local_6a0 [8];
  Message local_698 [15];
  bool local_689;
  undefined1 local_688 [8];
  AssertionResult gtest_ar__2;
  string local_670 [32];
  TraceID local_650;
  SamplingStatus local_640;
  AssertHelper local_620 [8];
  Message local_618 [8];
  undefined1 local_610 [8];
  AssertionResult gtest_ar_3;
  Tag thriftTagVec_1;
  Tag local_570 [8];
  Tag thriftTagArr_1;
  ulong local_4e0;
  size_t i_1;
  Message local_4d0 [8];
  size_type local_4c8;
  unsigned_long local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_488 [8];
  Message local_480 [15];
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__1;
  string local_458 [32];
  TraceID local_438;
  SamplingStatus local_428;
  AssertHelper local_408 [8];
  Message local_400 [8];
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_1;
  Tag thriftTagVec;
  Tag local_358 [8];
  Tag thriftTagArr;
  ulong local_2c8;
  size_t i;
  Message local_2b8 [8];
  size_type local_2b0;
  unsigned_long local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  AssertionResult local_288 [2];
  AssertHelper local_268 [8];
  Message local_260 [15];
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_;
  string local_238 [32];
  TraceID local_218;
  undefined1 local_208 [8];
  SamplingStatus result;
  AdaptiveSampler sampler;
  allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy> local_139;
  OperationSamplingStrategy *local_138;
  OperationSamplingStrategy local_130 [56];
  iterator local_f8;
  size_type local_f0;
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  local_e8;
  PerOperationSamplingStrategies local_d0 [8];
  PerOperationSamplingStrategies strategies;
  ProbabilisticSamplingStrategy local_90 [8];
  ProbabilisticSamplingStrategy probabilisticSampling;
  allocator local_69;
  string local_68 [32];
  OperationSamplingStrategy local_48 [8];
  OperationSamplingStrategy strategy;
  Sampler_testAdaptiveSampler_Test *this_local;
  
  sampling_manager::thrift::OperationSamplingStrategy::OperationSamplingStrategy(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"op",&local_69);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_operation
            ((string *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  sampling_manager::thrift::ProbabilisticSamplingStrategy::ProbabilisticSamplingStrategy(local_90);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::__set_samplingRate(0.5);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)local_48);
  sampling_manager::thrift::PerOperationSamplingStrategies::PerOperationSamplingStrategies(local_d0)
  ;
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  __set_defaultSamplingProbability(0.5);
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  __set_defaultLowerBoundTracesPerSecond(1.0);
  local_138 = local_130;
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::OperationSamplingStrategy
            (local_138,local_48);
  local_f8 = local_130;
  local_f0 = 1;
  std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>::allocator
            (&local_139);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::vector(&local_e8,__l,&local_139);
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  __set_perOperationStrategies((vector *)local_d0);
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::~vector(&local_e8);
  std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>::~allocator
            (&local_139);
  local_8f0 = (OperationSamplingStrategy *)&local_f8;
  do {
    local_8f0 = local_8f0 + -0x38;
    jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::~OperationSamplingStrategy
              (local_8f0);
  } while (local_8f0 != local_130);
  jaegertracing::samplers::AdaptiveSampler::AdaptiveSampler
            ((AdaptiveSampler *)
             &result._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_d0,10);
  TraceID::TraceID(&local_218,0,0x800000000000000a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"op",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  jaegertracing::samplers::AdaptiveSampler::isSampled
            ((TraceID *)local_208,
             (string *)
             &result._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  local_251 = SamplingStatus::isSampled((SamplingStatus *)local_208);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_288,local_250,"result.isSampled()","false");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_268,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=(local_268,local_260);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    std::__cxx11::string::~string((string *)local_288);
    testing::Message::~Message(local_260);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    local_2a8 = 2;
    pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
    local_2b0 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size(pvVar3);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_2a0,"sizeof(testLowerBoundExpectedTags) / sizeof(Tag)",
               "(result.tags()).size()",&local_2a8,&local_2b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(local_2b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0xed,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
      testing::Message::~Message(local_2b8);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      local_2c8 = 0;
      while( true ) {
        pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
        sVar4 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size(pvVar3);
        if (sVar4 <= local_2c8) break;
        thrift::Tag::Tag(local_358);
        thrift::Tag::Tag((Tag *)&gtest_ar_1.message_);
        jaegertracing::Tag::thrift
                  ((Tag *)((anonymous_namespace)::testLowerBoundExpectedTags + local_2c8 * 0x48));
        pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
        pvVar5 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator[]
                           (pvVar3,local_2c8);
        jaegertracing::Tag::thrift((Tag *)pvVar5);
        testing::internal::EqHelper<false>::
        Compare<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                  ((EqHelper<false> *)local_3f8,"thriftTagArr","thriftTagVec",local_358,
                   (Tag *)&gtest_ar_1.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
        if (!bVar1) {
          testing::Message::Message(local_400);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
          testing::internal::AssertHelper::AssertHelper
                    (local_408,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0xed,pcVar2);
          testing::internal::AssertHelper::operator=(local_408,local_400);
          testing::internal::AssertHelper::~AssertHelper(local_408);
          testing::Message::~Message(local_400);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          gtest_ar.message_.ptr_._4_4_ = 0;
        }
        jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_1.message_);
        jaegertracing::thrift::Tag::~Tag(local_358);
        if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_00304376;
        local_2c8 = local_2c8 + 1;
      }
      TraceID::TraceID(&local_438,0,0x7fffffffffffffec);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_458,"op",(allocator *)((long)&gtest_ar__1.message_.ptr_ + 7));
      jaegertracing::samplers::AdaptiveSampler::isSampled
                ((TraceID *)&local_428,
                 (string *)
                 &result._tags.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      SamplingStatus::operator=((SamplingStatus *)local_208,&local_428);
      SamplingStatus::~SamplingStatus(&local_428);
      std::__cxx11::string::~string(local_458);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
      local_471 = SamplingStatus::isSampled((SamplingStatus *)local_208);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_470,&local_471,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
      if (!bVar1) {
        testing::Message::Message(local_480);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)&gtest_ar_2.message_,local_470,"result.isSampled()","false");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_488,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0xf0,pcVar2);
        testing::internal::AssertHelper::operator=(local_488,local_480);
        testing::internal::AssertHelper::~AssertHelper(local_488);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(local_480);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        local_4c0 = 2;
        pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
        local_4c8 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size
                              (pvVar3);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_4b8,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)"
                   ,"(result.tags()).size()",&local_4c0,&local_4c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
        if (!bVar1) {
          testing::Message::Message(local_4d0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0xf1,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,local_4d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
          testing::Message::~Message(local_4d0);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          local_4e0 = 0;
          while( true ) {
            pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
            sVar4 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size
                              (pvVar3);
            if (sVar4 <= local_4e0) break;
            thrift::Tag::Tag(local_570);
            thrift::Tag::Tag((Tag *)&gtest_ar_3.message_);
            jaegertracing::Tag::thrift
                      ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags +
                              local_4e0 * 0x48));
            pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
            pvVar5 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
                     operator[](pvVar3,local_4e0);
            jaegertracing::Tag::thrift((Tag *)pvVar5);
            testing::internal::EqHelper<false>::
            Compare<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                      ((EqHelper<false> *)local_610,"thriftTagArr","thriftTagVec",local_570,
                       (Tag *)&gtest_ar_3.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
            if (!bVar1) {
              testing::Message::Message(local_618);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_610);
              testing::internal::AssertHelper::AssertHelper
                        (local_620,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                         ,0xf1,pcVar2);
              testing::internal::AssertHelper::operator=(local_620,local_618);
              testing::internal::AssertHelper::~AssertHelper(local_620);
              testing::Message::~Message(local_618);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              gtest_ar.message_.ptr_._4_4_ = 0;
            }
            jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_3.message_);
            jaegertracing::thrift::Tag::~Tag(local_570);
            if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_00304376;
            local_4e0 = local_4e0 + 1;
          }
          TraceID::TraceID(&local_650,0,0x800000000000000a);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_670,"op",(allocator *)((long)&gtest_ar__2.message_.ptr_ + 7));
          jaegertracing::samplers::AdaptiveSampler::isSampled
                    ((TraceID *)&local_640,
                     (string *)
                     &result._tags.
                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          SamplingStatus::operator=((SamplingStatus *)local_208,&local_640);
          SamplingStatus::~SamplingStatus(&local_640);
          std::__cxx11::string::~string(local_670);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&gtest_ar__2.message_.ptr_ + 7));
          bVar1 = SamplingStatus::isSampled((SamplingStatus *)local_208);
          local_689 = (bool)(~bVar1 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_688,&local_689,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
          if (!bVar1) {
            testing::Message::Message(local_698);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (local_6c0,local_688,"result.isSampled()","true");
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (local_6a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0xf4,pcVar2);
            testing::internal::AssertHelper::operator=(local_6a0,local_698);
            testing::internal::AssertHelper::~AssertHelper(local_6a0);
            std::__cxx11::string::~string((string *)local_6c0);
            testing::Message::~Message(local_698);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            TraceID::TraceID(&local_6f0,0,0x7fffffffffffffec);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_710,"firstTimeOp",(allocator *)((long)&gtest_ar__3.message_.ptr_ + 7));
            jaegertracing::samplers::AdaptiveSampler::isSampled
                      ((TraceID *)&local_6e0,
                       (string *)
                       &result._tags.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            SamplingStatus::operator=((SamplingStatus *)local_208,&local_6e0);
            SamplingStatus::~SamplingStatus(&local_6e0);
            std::__cxx11::string::~string(local_710);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
            local_729 = SamplingStatus::isSampled((SamplingStatus *)local_208);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_728,&local_729,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
            if (!bVar1) {
              testing::Message::Message(local_738);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&gtest_ar_4.message_,local_728,"result.isSampled()",
                         "false");
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (local_740,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                         ,0xf8,pcVar2);
              testing::internal::AssertHelper::operator=(local_740,local_738);
              testing::internal::AssertHelper::~AssertHelper(local_740);
              std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
              testing::Message::~Message(local_738);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_778 = 2;
              pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
              local_780 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size
                                    (pvVar3);
              testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                        ((EqHelper<false> *)local_770,
                         "sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
                         "(result.tags()).size()",&local_778,&local_780);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
              if (!bVar1) {
                testing::Message::Message(local_788);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&i_2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                           ,0xf9,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,local_788);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
                testing::Message::~Message(local_788);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                local_798 = 0;
                while( true ) {
                  pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
                  sVar4 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size
                                    (pvVar3);
                  if (sVar4 <= local_798) break;
                  thrift::Tag::Tag(local_828);
                  thrift::Tag::Tag((Tag *)&gtest_ar_5.message_);
                  jaegertracing::Tag::thrift
                            ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags +
                                    local_798 * 0x48));
                  pvVar3 = SamplingStatus::tags((SamplingStatus *)local_208);
                  pvVar5 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
                           operator[](pvVar3,local_798);
                  jaegertracing::Tag::thrift((Tag *)pvVar5);
                  testing::internal::EqHelper<false>::
                  Compare<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                            ((EqHelper<false> *)local_8c8,"thriftTagArr","thriftTagVec",local_828,
                             (Tag *)&gtest_ar_5.message_);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_8c8);
                  if (!bVar1) {
                    testing::Message::Message(local_8d0);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (local_8d8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                               ,0xf9,pcVar2);
                    testing::internal::AssertHelper::operator=(local_8d8,local_8d0);
                    testing::internal::AssertHelper::~AssertHelper(local_8d8);
                    testing::Message::~Message(local_8d0);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    gtest_ar.message_.ptr_._4_4_ = 0;
                  }
                  jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_5.message_);
                  jaegertracing::thrift::Tag::~Tag(local_828);
                  if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_00304376;
                  local_798 = local_798 + 1;
                }
                gtest_ar.message_.ptr_._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
LAB_00304376:
  SamplingStatus::~SamplingStatus((SamplingStatus *)local_208);
  AdaptiveSampler::~AdaptiveSampler
            ((AdaptiveSampler *)
             &result._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  ~PerOperationSamplingStrategies(local_d0);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
  ~ProbabilisticSamplingStrategy(local_90);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::~OperationSamplingStrategy
            (local_48);
  return;
}

Assistant:

TEST(Sampler, testAdaptiveSampler)
{
    namespace thriftgen = sampling_manager::thrift;

    thriftgen::OperationSamplingStrategy strategy;
    strategy.__set_operation(kTestOperationName);
    thriftgen::ProbabilisticSamplingStrategy probabilisticSampling;
    probabilisticSampling.__set_samplingRate(kTestDefaultSamplingProbability);
    strategy.__set_probabilisticSampling(probabilisticSampling);

    thriftgen::PerOperationSamplingStrategies strategies;
    strategies.__set_defaultSamplingProbability(
        kTestDefaultSamplingProbability);
    strategies.__set_defaultLowerBoundTracesPerSecond(1.0);
    strategies.__set_perOperationStrategies({ strategy });

    AdaptiveSampler sampler(strategies, kTestDefaultMaxOperations);
    auto result =
        sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
    ASSERT_TRUE(result.isSampled());
    CMP_TAGS(testLowerBoundExpectedTags, result.tags());

    result = sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
    ASSERT_TRUE(result.isSampled());
    CMP_TAGS(testProbablisticExpectedTags, result.tags());

    result = sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
    ASSERT_FALSE(result.isSampled());

    result = sampler.isSampled(TraceID(0, kTestMaxID - 20),
                               kTestFirstTimeOperationName);
    ASSERT_TRUE(result.isSampled());
    CMP_TAGS(testProbablisticExpectedTags, result.tags());
}